

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O2

void duckdb_je_emap_deregister_interior(tsdn_t *tsdn,emap_t *emap,edata_t *edata)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  rtree_leaf_elm_t *prVar8;
  ulong uVar9;
  long lVar10;
  uintptr_t addr;
  ulong key;
  ulong uVar11;
  ulong uVar12;
  rtree_ctx_t *ctx;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar6 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  if (0x2000 < uVar6) {
    uVar11 = (ulong)edata->e_addr & 0xfffffffffffff000;
    prVar8 = (rtree_leaf_elm_t *)0x0;
    uVar12 = uVar11 + 0x1000;
    for (key = uVar12; key <= (uVar6 + uVar11) - 0x2000; key = key + 0x1000) {
      if (key == uVar12 || (key & 0x3fffffff) == 0) {
        uVar7 = key & 0xffffffffc0000000;
        uVar9 = (ulong)(((uint)(key >> 0x1e) & 0xf) << 4);
        puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar9);
        uVar9 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar9);
        if (uVar9 == uVar7) {
          prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)(key >> 9) & 0x1ffff8) + puVar1[1]);
        }
        else if (ctx->l2_cache[0].leafkey == uVar7) {
          prVar8 = ctx->l2_cache[0].leaf;
          ctx->l2_cache[0].leafkey = uVar9;
          ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
          *puVar1 = uVar7;
          puVar1[1] = (ulong)prVar8;
          prVar8 = (rtree_leaf_elm_t *)
                   ((long)&(prVar8->le_bits).repr + (ulong)((uint)(key >> 9) & 0x1ffff8));
        }
        else {
          for (lVar10 = 0x118; lVar10 != 0x188; lVar10 = lVar10 + 0x10) {
            if (*(ulong *)((long)ctx->cache + lVar10 + -8) == uVar7) {
              uVar4 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar10);
              puVar2 = (undefined8 *)((long)ctx->cache + lVar10 + -0x18);
              uVar5 = puVar2[1];
              puVar3 = (undefined8 *)((long)ctx->cache + lVar10 + -8);
              *puVar3 = *puVar2;
              puVar3[1] = uVar5;
              *(ulong *)((long)ctx->cache + lVar10 + -0x18) = uVar9;
              *(ulong *)((long)(ctx->cache + -1) + lVar10) = puVar1[1];
              *puVar1 = uVar7;
              puVar1[1] = uVar4;
              prVar8 = (rtree_leaf_elm_t *)(((uint)(key >> 9) & 0x1ffff8) + uVar4);
              goto LAB_01e8bcdb;
            }
          }
          prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,ctx,key,true,false);
        }
      }
LAB_01e8bcdb:
      (prVar8->le_bits).repr = (void *)0xe8000000000000;
      prVar8 = prVar8 + 1;
    }
  }
  return;
}

Assistant:

void
emap_deregister_interior(tsdn_t *tsdn, emap_t *emap, edata_t *edata) {
	EMAP_DECLARE_RTREE_CTX;

	assert(edata_slab_get(edata));
	if (edata_size_get(edata) > (2 << LG_PAGE)) {
		rtree_clear_range(tsdn, &emap->rtree, rtree_ctx,
		    (uintptr_t)edata_base_get(edata) + PAGE,
		    (uintptr_t)edata_last_get(edata) - PAGE);
	}
}